

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

int __thiscall
btQuantizedBvh::sortAndCalcSplittingIndex
          (btQuantizedBvh *this,int startIndex,int endIndex,int splitAxis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  btVector3 bVar9;
  btVector3 bVar10;
  btVector3 center;
  float local_98;
  float local_88;
  float fStack_84;
  float local_78;
  float local_68;
  float fStack_64;
  undefined8 local_50;
  float local_48;
  undefined4 local_44;
  undefined1 local_40 [16];
  
  local_44 = 0;
  fVar7 = 0.0;
  fVar8 = 0.0;
  fVar6 = 0.0;
  iVar2 = endIndex - startIndex;
  iVar4 = startIndex;
  if (iVar2 != 0 && startIndex <= endIndex) {
    do {
      bVar9 = getAabbMax(this,iVar4);
      bVar10 = getAabbMin(this,iVar4);
      local_98 = bVar9.m_floats[2];
      local_88 = bVar9.m_floats[0];
      fStack_84 = bVar9.m_floats[1];
      fVar7 = fVar7 + (bVar10.m_floats[0] + local_88) * 0.5;
      fVar8 = fVar8 + (bVar10.m_floats[1] + fStack_84) * 0.5;
      fVar6 = fVar6 + (bVar10.m_floats[2] + local_98) * 0.5;
      iVar4 = iVar4 + 1;
    } while (endIndex != iVar4);
  }
  fVar5 = 1.0 / (float)iVar2;
  local_50 = CONCAT44(fVar5 * fVar8,fVar5 * fVar7);
  local_48 = fVar5 * fVar6;
  iVar4 = startIndex;
  if (startIndex < endIndex) {
    fVar6 = *(float *)((long)&local_50 + (long)splitAxis * 4);
    iVar1 = startIndex;
    do {
      bVar9 = getAabbMax(this,iVar1);
      bVar10 = getAabbMin(this,iVar1);
      local_78 = bVar9.m_floats[2];
      local_68 = bVar9.m_floats[0];
      fStack_64 = bVar9.m_floats[1];
      local_40._4_4_ = (bVar10.m_floats[1] + fStack_64) * 0.5;
      local_40._0_4_ = (bVar10.m_floats[0] + local_68) * 0.5;
      local_40._8_4_ = (bVar10.m_floats[2] + local_78) * 0.5;
      local_40._12_4_ = 0;
      if (fVar6 < *(float *)(local_40 + (long)splitAxis * 4)) {
        swapLeafNodes(this,iVar1,iVar4);
        iVar4 = iVar4 + 1;
      }
      iVar1 = iVar1 + 1;
    } while (endIndex != iVar1);
  }
  iVar3 = (iVar2 >> 1) + startIndex;
  iVar1 = iVar4;
  if (~(iVar2 / 3) + endIndex <= iVar4) {
    iVar1 = iVar3;
  }
  if (iVar4 <= iVar2 / 3 + startIndex) {
    iVar1 = iVar3;
  }
  return iVar1;
}

Assistant:

int	btQuantizedBvh::sortAndCalcSplittingIndex(int startIndex,int endIndex,int splitAxis)
{
	int i;
	int splitIndex =startIndex;
	int numIndices = endIndex - startIndex;
	btScalar splitValue;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(getAabbMax(i)+getAabbMin(i));
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);
	
	splitValue = means[splitAxis];
	
	//sort leafNodes so all values larger then splitValue comes first, and smaller values start from 'splitIndex'.
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(getAabbMax(i)+getAabbMin(i));
		if (center[splitAxis] > splitValue)
		{
			//swap
			swapLeafNodes(i,splitIndex);
			splitIndex++;
		}
	}

	//if the splitIndex causes unbalanced trees, fix this by using the center in between startIndex and endIndex
	//otherwise the tree-building might fail due to stack-overflows in certain cases.
	//unbalanced1 is unsafe: it can cause stack overflows
	//bool unbalanced1 = ((splitIndex==startIndex) || (splitIndex == (endIndex-1)));

	//unbalanced2 should work too: always use center (perfect balanced trees)	
	//bool unbalanced2 = true;

	//this should be safe too:
	int rangeBalancedIndices = numIndices/3;
	bool unbalanced = ((splitIndex<=(startIndex+rangeBalancedIndices)) || (splitIndex >=(endIndex-1-rangeBalancedIndices)));
	
	if (unbalanced)
	{
		splitIndex = startIndex+ (numIndices>>1);
	}

	bool unbal = (splitIndex==startIndex) || (splitIndex == (endIndex));
	(void)unbal;
	btAssert(!unbal);

	return splitIndex;
}